

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

int __thiscall polyscope::Group::isEnabled(Group *this)

{
  bool bVar1;
  int iVar2;
  iterator message;
  long in_RDI;
  int result;
  Group *group;
  WeakHandle<polyscope::Group> *groupWeak;
  iterator __end1_1;
  iterator __begin1_1;
  vector<polyscope::WeakHandle<polyscope::Group>,_std::allocator<polyscope::WeakHandle<polyscope::Group>_>_>
  *__range1_1;
  Structure *child;
  WeakHandle<polyscope::Structure> *childWeak;
  iterator __end1;
  iterator __begin1;
  vector<polyscope::WeakHandle<polyscope::Structure>,_std::allocator<polyscope::WeakHandle<polyscope::Structure>_>_>
  *__range1;
  bool any_children_disabled;
  bool any_children_enabled;
  vector<polyscope::WeakHandle<polyscope::Group>,_std::allocator<polyscope::WeakHandle<polyscope::Group>_>_>
  *in_stack_ffffffffffffff48;
  allocator *in_stack_ffffffffffffff50;
  int local_98;
  allocator local_81;
  string local_80 [32];
  Group *local_60;
  WeakHandle<polyscope::Group> *local_58;
  __normal_iterator<polyscope::WeakHandle<polyscope::Group>_*,_std::vector<polyscope::WeakHandle<polyscope::Group>,_std::allocator<polyscope::WeakHandle<polyscope::Group>_>_>_>
  local_48;
  long local_40;
  Structure *local_38;
  WeakHandle<polyscope::Structure> *local_30;
  WeakHandle<polyscope::Structure> *local_28;
  __normal_iterator<polyscope::WeakHandle<polyscope::Structure>_*,_std::vector<polyscope::WeakHandle<polyscope::Structure>,_std::allocator<polyscope::WeakHandle<polyscope::Structure>_>_>_>
  in_stack_ffffffffffffffe0;
  undefined6 in_stack_fffffffffffffff0;
  byte bVar3;
  byte bVar4;
  
  cullExpiredChildren((Group *)in_stack_ffffffffffffffe0._M_current);
  bVar4 = 0;
  bVar3 = 0;
  std::
  vector<polyscope::WeakHandle<polyscope::Structure>,_std::allocator<polyscope::WeakHandle<polyscope::Structure>_>_>
  ::begin((vector<polyscope::WeakHandle<polyscope::Structure>,_std::allocator<polyscope::WeakHandle<polyscope::Structure>_>_>
           *)in_stack_ffffffffffffff48);
  local_28 = (WeakHandle<polyscope::Structure> *)
             std::
             vector<polyscope::WeakHandle<polyscope::Structure>,_std::allocator<polyscope::WeakHandle<polyscope::Structure>_>_>
             ::end((vector<polyscope::WeakHandle<polyscope::Structure>,_std::allocator<polyscope::WeakHandle<polyscope::Structure>_>_>
                    *)in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<polyscope::WeakHandle<polyscope::Structure>_*,_std::vector<polyscope::WeakHandle<polyscope::Structure>,_std::allocator<polyscope::WeakHandle<polyscope::Structure>_>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<polyscope::WeakHandle<polyscope::Structure>_*,_std::vector<polyscope::WeakHandle<polyscope::Structure>,_std::allocator<polyscope::WeakHandle<polyscope::Structure>_>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    local_30 = __gnu_cxx::
               __normal_iterator<polyscope::WeakHandle<polyscope::Structure>_*,_std::vector<polyscope::WeakHandle<polyscope::Structure>,_std::allocator<polyscope::WeakHandle<polyscope::Structure>_>_>_>
               ::operator*((__normal_iterator<polyscope::WeakHandle<polyscope::Structure>_*,_std::vector<polyscope::WeakHandle<polyscope::Structure>,_std::allocator<polyscope::WeakHandle<polyscope::Structure>_>_>_>
                            *)&stack0xffffffffffffffe0);
    bVar1 = GenericWeakHandle::isValid((GenericWeakHandle *)0x3d4079);
    if (bVar1) {
      local_38 = WeakHandle<polyscope::Structure>::get(local_30);
      bVar1 = Structure::isEnabled((Structure *)0x3d40a1);
      if (bVar1) {
        bVar4 = 1;
      }
      else {
        bVar3 = 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<polyscope::WeakHandle<polyscope::Structure>_*,_std::vector<polyscope::WeakHandle<polyscope::Structure>,_std::allocator<polyscope::WeakHandle<polyscope::Structure>_>_>_>
    ::operator++((__normal_iterator<polyscope::WeakHandle<polyscope::Structure>_*,_std::vector<polyscope::WeakHandle<polyscope::Structure>,_std::allocator<polyscope::WeakHandle<polyscope::Structure>_>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  local_40 = in_RDI + 0x48;
  local_48._M_current =
       (WeakHandle<polyscope::Group> *)
       std::
       vector<polyscope::WeakHandle<polyscope::Group>,_std::allocator<polyscope::WeakHandle<polyscope::Group>_>_>
       ::begin(in_stack_ffffffffffffff48);
  message = std::
            vector<polyscope::WeakHandle<polyscope::Group>,_std::allocator<polyscope::WeakHandle<polyscope::Group>_>_>
            ::end(in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<polyscope::WeakHandle<polyscope::Group>_*,_std::vector<polyscope::WeakHandle<polyscope::Group>,_std::allocator<polyscope::WeakHandle<polyscope::Group>_>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<polyscope::WeakHandle<polyscope::Group>_*,_std::vector<polyscope::WeakHandle<polyscope::Group>,_std::allocator<polyscope::WeakHandle<polyscope::Group>_>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<polyscope::WeakHandle<polyscope::Group>_*,_std::vector<polyscope::WeakHandle<polyscope::Group>,_std::allocator<polyscope::WeakHandle<polyscope::Group>_>_>_>
               ::operator*(&local_48);
    bVar1 = GenericWeakHandle::isValid((GenericWeakHandle *)0x3d412c);
    if (bVar1) {
      local_60 = WeakHandle<polyscope::Group>::get(local_58);
      iVar2 = isEnabled((Group *)CONCAT17(bVar4,CONCAT16(bVar3,in_stack_fffffffffffffff0)));
      switch(iVar2) {
      case 0:
        bVar3 = 1;
        break;
      case 1:
        bVar4 = 1;
        break;
      case -2:
        break;
      case -1:
        bVar4 = 1;
        bVar3 = 1;
        break;
      default:
        in_stack_ffffffffffffff50 = &local_81;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_80,"Unexpected return value from Group::isEnabled()",
                   in_stack_ffffffffffffff50);
        exception((string *)message._M_current);
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
      }
    }
    __gnu_cxx::
    __normal_iterator<polyscope::WeakHandle<polyscope::Group>_*,_std::vector<polyscope::WeakHandle<polyscope::Group>,_std::allocator<polyscope::WeakHandle<polyscope::Group>_>_>_>
    ::operator++(&local_48);
  }
  local_98 = 0;
  if (((bVar4 & 1) != 0) && ((bVar3 & 1) == 0)) {
    local_98 = 1;
  }
  if (((bVar4 & 1) != 0) && ((bVar3 & 1) != 0)) {
    local_98 = -1;
  }
  if (((bVar4 & 1) == 0) && ((bVar3 & 1) == 0)) {
    local_98 = -2;
  }
  return local_98;
}

Assistant:

int Group::isEnabled() {

  // return values:
  // 0: all children disabled
  // 1: all children enabled
  // -1: some children enabled, some disabled
  // -2: no children
  // (these -2 groups should not have a checkbox in the UI - there's nothing to enable / disable -
  // unless we added a is_enabled state for empty groups, but this could lead to edge cases)

  cullExpiredChildren();

  bool any_children_enabled = false;
  bool any_children_disabled = false;
  // check all structure children

  for (WeakHandle<Structure>& childWeak : childrenStructures) {
    if (childWeak.isValid()) {
      Structure& child = childWeak.get();
      if (child.isEnabled()) {
        any_children_enabled = true;
      } else {
        any_children_disabled = true;
      }
    }
  }

  // check all group children
  for (WeakHandle<Group>& groupWeak : childrenGroups) {
    if (groupWeak.isValid()) {
      Group& group = groupWeak.get();
      switch (group.isEnabled()) {
      case 1:
        any_children_enabled = true;
        break;
      case 0:
        any_children_disabled = true;
        break;
      case -1:
        any_children_enabled = true;
        any_children_disabled = true;
        break;
      case -2:
        break;
      default:
        exception("Unexpected return value from Group::isEnabled()");
      }
    }
  }

  int result = 0;
  if (!any_children_enabled && any_children_disabled) {
    result = 0;
  }
  if (any_children_enabled && !any_children_disabled) {
    result = 1;
  }
  if (any_children_enabled && any_children_disabled) {
    result = -1;
  }
  if (!any_children_enabled && !any_children_disabled) {
    result = -2;
  }
  return result;
}